

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VCFilterFile>::Inserter::insertOne
          (Inserter *this,qsizetype pos,VCFilterFile *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  VCFilterFile *pVVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  VCFilterFile *pVVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pVVar3 = this->begin;
  lVar11 = this->size;
  pVVar7 = pVVar3 + lVar11;
  this->end = pVVar7;
  this->last = pVVar3 + lVar11 + -1;
  lVar11 = lVar11 - pos;
  this->where = pVVar3 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct != 0) {
    pVVar7->excludeFromBuild = t->excludeFromBuild;
    pDVar4 = (t->file).d.d;
    (t->file).d.d = (Data *)0x0;
    (pVVar7->file).d.d = pDVar4;
    pcVar5 = (t->file).d.ptr;
    (t->file).d.ptr = (char16_t *)0x0;
    (pVVar7->file).d.ptr = pcVar5;
    qVar6 = (t->file).d.size;
    (t->file).d.size = 0;
    (pVVar7->file).d.size = qVar6;
    this->size = this->size + 1;
    return;
  }
  pVVar7->excludeFromBuild = pVVar7[-1].excludeFromBuild;
  pDVar4 = pVVar7[-1].file.d.d;
  pcVar5 = pVVar7[-1].file.d.ptr;
  pVVar7[-1].file.d.d = (Data *)0x0;
  pVVar7[-1].file.d.ptr = (char16_t *)0x0;
  (pVVar7->file).d.d = pDVar4;
  (pVVar7->file).d.ptr = pcVar5;
  qVar6 = pVVar7[-1].file.d.size;
  pVVar7[-1].file.d.size = 0;
  (pVVar7->file).d.size = qVar6;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      pVVar7 = this->last;
      (&pVVar7->excludeFromBuild)[lVar11] = (&pVVar7[-1].excludeFromBuild)[lVar11];
      puVar1 = (undefined8 *)((long)&(pVVar7->file).d.d + lVar11);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)pVVar7 + lVar11 + -0x18);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pVVar7->file).d.d + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)pVVar7 + lVar11 + -0x18);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pVVar7->file).d.size + lVar11);
      *(undefined8 *)((long)&(pVVar7->file).d.size + lVar11) =
           *(undefined8 *)((long)pVVar7 + lVar11 + -8);
      *(undefined8 *)((long)pVVar7 + lVar11 + -8) = uVar8;
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x20;
    } while (lVar12 != this->move);
  }
  pVVar7 = this->where;
  pVVar7->excludeFromBuild = t->excludeFromBuild;
  pDVar4 = (pVVar7->file).d.d;
  (pVVar7->file).d.d = (t->file).d.d;
  (t->file).d.d = pDVar4;
  pcVar5 = (pVVar7->file).d.ptr;
  (pVVar7->file).d.ptr = (t->file).d.ptr;
  (t->file).d.ptr = pcVar5;
  qVar6 = (pVVar7->file).d.size;
  (pVVar7->file).d.size = (t->file).d.size;
  (t->file).d.size = qVar6;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }